

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoder_dict.cpp
# Opt level: O0

void duckdb_brotli::BrotliInitSharedEncoderDictionary(SharedEncoderDictionary *dict)

{
  undefined4 *in_RDI;
  
  *in_RDI = 0xdebcede1;
  *(undefined8 *)(in_RDI + 2) = 0;
  *(undefined8 *)(in_RDI + 4) = 0;
  *(undefined8 *)(in_RDI + 0x46) = 0;
  *(undefined8 *)(in_RDI + 0x66) = 0;
  in_RDI[0x88] = 0;
  *(undefined1 *)(in_RDI + 0x89) = 1;
  *(undefined8 *)(in_RDI + 0x146) = 0;
  *(undefined8 *)(in_RDI + 0x11a) = 1;
  *(undefined4 **)(in_RDI + 0x9a) = in_RDI + 0x11c;
  InitEncoderDictionary((BrotliEncoderDictionary *)0x795950);
  *(undefined4 **)(in_RDI + 0x136) = in_RDI + 0x88;
  in_RDI[0x148] = 0xb;
  return;
}

Assistant:

void duckdb_brotli::BrotliInitSharedEncoderDictionary(SharedEncoderDictionary* dict) {
  dict->magic = kSharedDictionaryMagic;

  dict->compound.num_chunks = 0;
  dict->compound.total_size = 0;
  dict->compound.chunk_offsets[0] = 0;
  dict->compound.num_prepared_instances_ = 0;

  dict->contextual.context_based = 0;
  dict->contextual.num_dictionaries = 1;
  dict->contextual.instances_ = 0;
  dict->contextual.num_instances_ = 1;  /* The instance_ field */
  dict->contextual.dict[0] = &dict->contextual.instance_;
  InitEncoderDictionary(&dict->contextual.instance_);
  dict->contextual.instance_.parent = &dict->contextual;

  dict->max_quality = BROTLI_MAX_QUALITY;
}